

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O0

SyscallResult
kj::_::Debug::syscall<kj::(anonymous_namespace)::TestCase482::run()::__14>
          (anon_class_16_2_f8bdc765 *call,bool nonblocking)

{
  int errorNumber;
  ssize_t sVar1;
  int errorNum;
  bool nonblocking_local;
  anon_class_16_2_f8bdc765 *call_local;
  
  do {
    sVar1 = kj::anon_unknown_0::TestCase482::run::anon_class_16_2_f8bdc765::operator()(call);
    if (-1 < sVar1) {
      SyscallResult::SyscallResult((SyscallResult *)((long)&call_local + 4),0);
      return (SyscallResult)call_local._4_4_;
    }
    errorNumber = getOsErrorNumber(nonblocking);
  } while (errorNumber == -1);
  SyscallResult::SyscallResult((SyscallResult *)((long)&call_local + 4),errorNumber);
  return (SyscallResult)call_local._4_4_;
}

Assistant:

Debug::SyscallResult Debug::syscall(Call&& call, bool nonblocking) {
  while (call() < 0) {
    int errorNum = getOsErrorNumber(nonblocking);
    // getOsErrorNumber() returns -1 to indicate EINTR.
    // Also, if nonblocking is true, then it returns 0 on EAGAIN, which will then be treated as a
    // non-error.
    if (errorNum != -1) {
      return SyscallResult(errorNum);
    }
  }
  return SyscallResult(0);
}